

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpMapMatrix.cpp
# Opt level: O1

void mnf::ExpMapMatrix::applyDiffPseudoLog0_
               (RefMat *out,ConstRefMat *in,ConstRefVec *x,ReusableTemporaryMap *m)

{
  long lVar1;
  ulong size;
  char *__function;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_> a;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_159;
  Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_> local_158;
  SrcEvaluatorType local_138;
  DstEvaluatorType local_120;
  Matrix<double,_3,_9,_0,_3,_9> local_108;
  
  if ((in->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value != 3) {
    __assert_fail("in.cols() == InputDim_ && \"Dimensions mismatch\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/src/ExpMapMatrix.cpp"
                  ,0xf5,
                  "static void mnf::ExpMapMatrix::applyDiffPseudoLog0_(RefMat, const ConstRefMat &, const ConstRefVec &, ReusableTemporaryMap &)"
                 );
  }
  lVar1 = (in->
          super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value;
  size = lVar1 * 9;
  if (m->size_ < size) {
    ReusableTemporaryMap::reallocate_(m,size);
  }
  local_158.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>.
  m_data = m->buffer_;
  local_158.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>.
  m_cols.m_value = 9;
  local_158.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>.
  super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>.
  m_rows.m_value = lVar1;
  if (lVar1 < 0 &&
      local_158.
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>
      .m_data != (double *)0x0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                  "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 16>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 16>, Level = 0]"
                 );
  }
  if ((size & 0x1ffffffffffffffe) != 0 &&
      ((ulong)local_158.
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>
              .m_data & 0xf) != 0) {
    __assert_fail("( ((internal::UIntPtr(m_data) % internal::traits<Derived>::Alignment) == 0) || (cols() * rows() * minInnerStride * sizeof(Scalar)) < internal::traits<Derived>::Alignment ) && \"data is not aligned\""
                  ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",199,
                  "void Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 16>, 0>::checkSanity(typename internal::enable_if<(internal::traits<T>::Alignment > 0), void *>::type) const [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 16>, Level = 0, T = Eigen::Map<Eigen::Matrix<double, -1, -1>, 16>]"
                 );
  }
  diffPseudoLog0_(&local_108,x);
  if ((in->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 3) {
    if ((local_158.
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>
         .
         super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>
         .m_rows.m_value ==
         (in->
         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_rows.m_value) &&
       (local_158.
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value == 9)) {
      Eigen::internal::
      generic_product_impl<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>,Eigen::Matrix<double,3,9,0,3,9>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::evalTo<Eigen::Map<Eigen::Matrix<double,_1,_1,0,_1,_1>,16,Eigen::Stride<0,0>>>
                (&local_158,in,&local_108);
      local_138.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_data = local_158.
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_138.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
      .m_outerStride.m_value =
           local_158.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      if (((out->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value ==
           local_158.
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value) &&
         ((out->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value ==
          local_158.
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value)) {
        local_120.
        super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = (out->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
        array[0] = (double)&local_120;
        local_120.
        super_mapbase_evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value =
             (out->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
        array[1] = (double)&local_138;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
        array[2] = (double)&local_159;
        local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>.m_storage.m_data.
        array[3] = (double)out;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_16,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_16,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)&local_108);
        return;
      }
      __function = 
      "void Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1>>]"
      ;
    }
    else {
      __function = 
      "void Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double, -1, -1>, 16>>::resize(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, -1>, 16>]"
      ;
    }
    __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,__function);
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                "Eigen::Product<Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, Eigen::Matrix<double, 3, 9>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Ref<const Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::Matrix<double, 3, 9>, Option = 0]"
               );
}

Assistant:

void ExpMapMatrix::applyDiffPseudoLog0_(RefMat out, const ConstRefMat& in,
                                        const ConstRefVec& x,
                                        ReusableTemporaryMap& m)
{
  mnf_assert(in.cols() == InputDim_ && "Dimensions mismatch");
  Eigen::Map<Eigen::MatrixXd, Eigen::Aligned> a =
      m.getMap(in.rows(), OutputDim_);
  a.noalias() = in * diffPseudoLog0_(x);
  out = a;
}